

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O2

Offset<MyGame::Example::Monster>
MyGame::Example::CreateMonster
          (FlatBufferBuilder *_fbb,Vec3 *pos,int16_t mana,int16_t hp,
          Offset<flatbuffers::String> name,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> inventory,Color color,
          Any test_type,Offset<void> test,
          Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> test4,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          testarrayofstring,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_>
          testarrayoftables,Offset<MyGame::Example::Monster> enemy,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testnestedflatbuffer,
          Offset<MyGame::Example::Stat> testempty,bool testbool,int32_t testhashs32_fnv1,
          uint32_t testhashu32_fnv1,int64_t testhashs64_fnv1,uint64_t testhashu64_fnv1,
          int32_t testhashs32_fnv1a,uint32_t testhashu32_fnv1a,int64_t testhashs64_fnv1a,
          uint64_t testhashu64_fnv1a,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testarrayofbools,float testf,
          float testf2,float testf3,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          testarrayofstring2,
          Offset<flatbuffers::Vector<const_MyGame::Example::Ability_*,_unsigned_int>_>
          testarrayofsortedstruct,Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> flex,
          Offset<flatbuffers::Vector<const_MyGame::Example::Test_*,_unsigned_int>_> test5,
          Offset<flatbuffers::Vector<long,_unsigned_int>_> vector_of_longs,
          Offset<flatbuffers::Vector<double,_unsigned_int>_> vector_of_doubles,
          Offset<MyGame::InParentNamespace> parent_namespace_test,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
          vector_of_referrables,uint64_t single_weak_reference,
          Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> vector_of_weak_references,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>_>
          vector_of_strong_referrables,uint64_t co_owning_reference,
          Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> vector_of_co_owning_references,
          uint64_t non_owning_reference,
          Offset<flatbuffers::Vector<unsigned_long,_unsigned_int>_> vector_of_non_owning_references,
          AnyUniqueAliases any_unique_type,Offset<void> any_unique,
          AnyAmbiguousAliases any_ambiguous_type,Offset<void> any_ambiguous,
          Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> vector_of_enums,Race signed_enum
          ,Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> testrequirednestedflatbuffer,
          Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>_>
          scalar_key_sorted_tables,Test *native_inline,LongEnum long_enum_non_enum_default,
          LongEnum long_enum_normal_default,float nan_default,float inf_default,
          float positive_inf_default,float infinity_default,float positive_infinity_default,
          float negative_inf_default,float negative_infinity_default,double double_inf_default)

{
  Offset<MyGame::Example::Monster> OVar1;
  MonsterBuilder local_40;
  
  local_40.fbb_ = _fbb;
  local_40.start_ = flatbuffers::FlatBufferBuilderImpl<false>::StartTable(_fbb);
  MonsterBuilder::add_double_inf_default(&local_40,double_inf_default);
  MonsterBuilder::add_long_enum_normal_default(&local_40,long_enum_normal_default);
  MonsterBuilder::add_long_enum_non_enum_default(&local_40,long_enum_non_enum_default);
  MonsterBuilder::add_non_owning_reference(&local_40,non_owning_reference);
  MonsterBuilder::add_co_owning_reference(&local_40,co_owning_reference);
  MonsterBuilder::add_single_weak_reference(&local_40,single_weak_reference);
  MonsterBuilder::add_testhashu64_fnv1a(&local_40,testhashu64_fnv1a);
  MonsterBuilder::add_testhashs64_fnv1a(&local_40,testhashs64_fnv1a);
  MonsterBuilder::add_testhashu64_fnv1(&local_40,testhashu64_fnv1);
  MonsterBuilder::add_testhashs64_fnv1(&local_40,testhashs64_fnv1);
  MonsterBuilder::add_negative_infinity_default(&local_40,negative_infinity_default);
  MonsterBuilder::add_negative_inf_default(&local_40,negative_inf_default);
  MonsterBuilder::add_positive_infinity_default(&local_40,positive_infinity_default);
  MonsterBuilder::add_infinity_default(&local_40,infinity_default);
  MonsterBuilder::add_positive_inf_default(&local_40,positive_inf_default);
  MonsterBuilder::add_inf_default(&local_40,inf_default);
  MonsterBuilder::add_nan_default(&local_40,nan_default);
  MonsterBuilder::add_native_inline(&local_40,native_inline);
  MonsterBuilder::add_scalar_key_sorted_tables(&local_40,scalar_key_sorted_tables);
  MonsterBuilder::add_testrequirednestedflatbuffer(&local_40,testrequirednestedflatbuffer);
  MonsterBuilder::add_vector_of_enums(&local_40,vector_of_enums);
  MonsterBuilder::add_any_ambiguous(&local_40,any_ambiguous);
  MonsterBuilder::add_any_unique(&local_40,any_unique);
  MonsterBuilder::add_vector_of_non_owning_references(&local_40,vector_of_non_owning_references);
  MonsterBuilder::add_vector_of_co_owning_references(&local_40,vector_of_co_owning_references);
  MonsterBuilder::add_vector_of_strong_referrables(&local_40,vector_of_strong_referrables);
  MonsterBuilder::add_vector_of_weak_references(&local_40,vector_of_weak_references);
  MonsterBuilder::add_vector_of_referrables(&local_40,vector_of_referrables);
  MonsterBuilder::add_parent_namespace_test(&local_40,parent_namespace_test);
  MonsterBuilder::add_vector_of_doubles(&local_40,vector_of_doubles);
  MonsterBuilder::add_vector_of_longs(&local_40,vector_of_longs);
  MonsterBuilder::add_test5(&local_40,test5);
  MonsterBuilder::add_flex(&local_40,flex);
  MonsterBuilder::add_testarrayofsortedstruct(&local_40,testarrayofsortedstruct);
  MonsterBuilder::add_testarrayofstring2(&local_40,testarrayofstring2);
  MonsterBuilder::add_testf3(&local_40,testf3);
  MonsterBuilder::add_testf2(&local_40,testf2);
  MonsterBuilder::add_testf(&local_40,testf);
  MonsterBuilder::add_testarrayofbools(&local_40,testarrayofbools);
  MonsterBuilder::add_testhashu32_fnv1a(&local_40,testhashu32_fnv1a);
  MonsterBuilder::add_testhashs32_fnv1a(&local_40,testhashs32_fnv1a);
  MonsterBuilder::add_testhashu32_fnv1(&local_40,testhashu32_fnv1);
  MonsterBuilder::add_testhashs32_fnv1(&local_40,testhashs32_fnv1);
  MonsterBuilder::add_testempty(&local_40,testempty);
  MonsterBuilder::add_testnestedflatbuffer(&local_40,testnestedflatbuffer);
  MonsterBuilder::add_enemy(&local_40,enemy);
  MonsterBuilder::add_testarrayoftables(&local_40,testarrayoftables);
  MonsterBuilder::add_testarrayofstring(&local_40,testarrayofstring);
  MonsterBuilder::add_test4(&local_40,test4);
  MonsterBuilder::add_test(&local_40,test);
  MonsterBuilder::add_inventory(&local_40,inventory);
  MonsterBuilder::add_name(&local_40,name);
  MonsterBuilder::add_pos(&local_40,pos);
  MonsterBuilder::add_hp(&local_40,hp);
  MonsterBuilder::add_mana(&local_40,mana);
  MonsterBuilder::add_signed_enum(&local_40,signed_enum);
  MonsterBuilder::add_any_ambiguous_type(&local_40,any_ambiguous_type);
  MonsterBuilder::add_any_unique_type(&local_40,any_unique_type);
  MonsterBuilder::add_testbool(&local_40,testbool);
  MonsterBuilder::add_test_type(&local_40,test_type);
  MonsterBuilder::add_color(&local_40,color);
  OVar1 = MonsterBuilder::Finish(&local_40);
  return (Offset<MyGame::Example::Monster>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Monster> CreateMonster(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    const MyGame::Example::Vec3 *pos = nullptr,
    int16_t mana = 150,
    int16_t hp = 100,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> inventory = 0,
    MyGame::Example::Color color = MyGame::Example::Color_Blue,
    MyGame::Example::Any test_type = MyGame::Example::Any_NONE,
    ::flatbuffers::Offset<void> test = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<const MyGame::Example::Test *>> test4 = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> testarrayofstring = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Example::Monster>>> testarrayoftables = 0,
    ::flatbuffers::Offset<MyGame::Example::Monster> enemy = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> testnestedflatbuffer = 0,
    ::flatbuffers::Offset<MyGame::Example::Stat> testempty = 0,
    bool testbool = false,
    int32_t testhashs32_fnv1 = 0,
    uint32_t testhashu32_fnv1 = 0,
    int64_t testhashs64_fnv1 = 0,
    uint64_t testhashu64_fnv1 = 0,
    int32_t testhashs32_fnv1a = 0,
    uint32_t testhashu32_fnv1a = 0,
    int64_t testhashs64_fnv1a = 0,
    uint64_t testhashu64_fnv1a = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> testarrayofbools = 0,
    float testf = 3.14159f,
    float testf2 = 3.0f,
    float testf3 = 0.0f,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> testarrayofstring2 = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<const MyGame::Example::Ability *>> testarrayofsortedstruct = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> flex = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<const MyGame::Example::Test *>> test5 = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<int64_t>> vector_of_longs = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<double>> vector_of_doubles = 0,
    ::flatbuffers::Offset<MyGame::InParentNamespace> parent_namespace_test = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Example::Referrable>>> vector_of_referrables = 0,
    uint64_t single_weak_reference = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint64_t>> vector_of_weak_references = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Example::Referrable>>> vector_of_strong_referrables = 0,
    uint64_t co_owning_reference = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint64_t>> vector_of_co_owning_references = 0,
    uint64_t non_owning_reference = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint64_t>> vector_of_non_owning_references = 0,
    MyGame::Example::AnyUniqueAliases any_unique_type = MyGame::Example::AnyUniqueAliases_NONE,
    ::flatbuffers::Offset<void> any_unique = 0,
    MyGame::Example::AnyAmbiguousAliases any_ambiguous_type = MyGame::Example::AnyAmbiguousAliases_NONE,
    ::flatbuffers::Offset<void> any_ambiguous = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> vector_of_enums = 0,
    MyGame::Example::Race signed_enum = MyGame::Example::Race_None,
    ::flatbuffers::Offset<::flatbuffers::Vector<uint8_t>> testrequirednestedflatbuffer = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<MyGame::Example::Stat>>> scalar_key_sorted_tables = 0,
    const MyGame::Example::Test *native_inline = nullptr,
    MyGame::Example::LongEnum long_enum_non_enum_default = static_cast<MyGame::Example::LongEnum>(0),
    MyGame::Example::LongEnum long_enum_normal_default = MyGame::Example::LongEnum_LongOne,
    float nan_default = std::numeric_limits<float>::quiet_NaN(),
    float inf_default = std::numeric_limits<float>::infinity(),
    float positive_inf_default = std::numeric_limits<float>::infinity(),
    float infinity_default = std::numeric_limits<float>::infinity(),
    float positive_infinity_default = std::numeric_limits<float>::infinity(),
    float negative_inf_default = -std::numeric_limits<float>::infinity(),
    float negative_infinity_default = -std::numeric_limits<float>::infinity(),
    double double_inf_default = std::numeric_limits<double>::infinity()) {
  MonsterBuilder builder_(_fbb);
  builder_.add_double_inf_default(double_inf_default);
  builder_.add_long_enum_normal_default(long_enum_normal_default);
  builder_.add_long_enum_non_enum_default(long_enum_non_enum_default);
  builder_.add_non_owning_reference(non_owning_reference);
  builder_.add_co_owning_reference(co_owning_reference);
  builder_.add_single_weak_reference(single_weak_reference);
  builder_.add_testhashu64_fnv1a(testhashu64_fnv1a);
  builder_.add_testhashs64_fnv1a(testhashs64_fnv1a);
  builder_.add_testhashu64_fnv1(testhashu64_fnv1);
  builder_.add_testhashs64_fnv1(testhashs64_fnv1);
  builder_.add_negative_infinity_default(negative_infinity_default);
  builder_.add_negative_inf_default(negative_inf_default);
  builder_.add_positive_infinity_default(positive_infinity_default);
  builder_.add_infinity_default(infinity_default);
  builder_.add_positive_inf_default(positive_inf_default);
  builder_.add_inf_default(inf_default);
  builder_.add_nan_default(nan_default);
  builder_.add_native_inline(native_inline);
  builder_.add_scalar_key_sorted_tables(scalar_key_sorted_tables);
  builder_.add_testrequirednestedflatbuffer(testrequirednestedflatbuffer);
  builder_.add_vector_of_enums(vector_of_enums);
  builder_.add_any_ambiguous(any_ambiguous);
  builder_.add_any_unique(any_unique);
  builder_.add_vector_of_non_owning_references(vector_of_non_owning_references);
  builder_.add_vector_of_co_owning_references(vector_of_co_owning_references);
  builder_.add_vector_of_strong_referrables(vector_of_strong_referrables);
  builder_.add_vector_of_weak_references(vector_of_weak_references);
  builder_.add_vector_of_referrables(vector_of_referrables);
  builder_.add_parent_namespace_test(parent_namespace_test);
  builder_.add_vector_of_doubles(vector_of_doubles);
  builder_.add_vector_of_longs(vector_of_longs);
  builder_.add_test5(test5);
  builder_.add_flex(flex);
  builder_.add_testarrayofsortedstruct(testarrayofsortedstruct);
  builder_.add_testarrayofstring2(testarrayofstring2);
  builder_.add_testf3(testf3);
  builder_.add_testf2(testf2);
  builder_.add_testf(testf);
  builder_.add_testarrayofbools(testarrayofbools);
  builder_.add_testhashu32_fnv1a(testhashu32_fnv1a);
  builder_.add_testhashs32_fnv1a(testhashs32_fnv1a);
  builder_.add_testhashu32_fnv1(testhashu32_fnv1);
  builder_.add_testhashs32_fnv1(testhashs32_fnv1);
  builder_.add_testempty(testempty);
  builder_.add_testnestedflatbuffer(testnestedflatbuffer);
  builder_.add_enemy(enemy);
  builder_.add_testarrayoftables(testarrayoftables);
  builder_.add_testarrayofstring(testarrayofstring);
  builder_.add_test4(test4);
  builder_.add_test(test);
  builder_.add_inventory(inventory);
  builder_.add_name(name);
  builder_.add_pos(pos);
  builder_.add_hp(hp);
  builder_.add_mana(mana);
  builder_.add_signed_enum(signed_enum);
  builder_.add_any_ambiguous_type(any_ambiguous_type);
  builder_.add_any_unique_type(any_unique_type);
  builder_.add_testbool(testbool);
  builder_.add_test_type(test_type);
  builder_.add_color(color);
  return builder_.Finish();
}